

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

mat<double,_3,_3> * linalg::qmat<double>(vec<double,_4> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  mat<double,_3,_3> *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar6 = q->w;
  dVar1 = q->x;
  dVar5 = q->y;
  dVar2 = q->z;
  dVar7 = -dVar5 * dVar5;
  dVar12 = dVar6 * dVar6 - dVar1 * dVar1;
  dVar8 = dVar1 * dVar5 + dVar6 * q->z;
  dVar9 = dVar1 * dVar2 + -dVar5 * q->w;
  dVar10 = dVar1 * dVar5 - dVar6 * dVar2;
  dVar3 = q->x;
  dVar4 = q->y;
  dVar11 = dVar5 * dVar2 - dVar6 * dVar1;
  (in_RDI->x).x = dVar6 * dVar6 + dVar1 * dVar1 + dVar7 + -dVar2 * dVar2;
  (in_RDI->x).y = dVar8 + dVar8;
  (in_RDI->x).z = dVar9 + dVar9;
  (in_RDI->y).x = dVar10 + dVar10;
  (in_RDI->y).y = dVar5 * dVar5 + dVar12 + -dVar2 * dVar2;
  dVar5 = dVar5 * dVar2 + dVar6 * dVar3;
  dVar6 = dVar1 * dVar2 + dVar6 * dVar4;
  (in_RDI->y).z = dVar5 + dVar5;
  (in_RDI->z).x = dVar6 + dVar6;
  (in_RDI->z).y = dVar11 + dVar11;
  (in_RDI->z).z = dVar2 * dVar2 + dVar7 + dVar12;
  return in_RDI;
}

Assistant:

T                    qangle(const vec<T,4> & q)                          { return std::atan2(length(q.xyz()), q.w)*2; }